

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O1

REF_STATUS ref_cavity_change(REF_CAVITY ref_cavity,REF_DBL *min_del,REF_DBL *min_add)

{
  int iVar1;
  REF_NODE pRVar2;
  REF_CELL ref_cell;
  REF_INT *pRVar3;
  bool bVar4;
  uint uVar5;
  REF_LIST pRVar6;
  long lVar7;
  long lVar8;
  int node0;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  REF_DBL quality;
  REF_DBL r1;
  REF_DBL r0;
  REF_INT nodes [27];
  uint local_fc;
  double local_e0;
  double *local_d8;
  REF_NODE local_d0;
  REF_DBL *local_c8;
  double local_c0;
  REF_DBL local_b8;
  REF_DBL local_b0;
  REF_INT local_a8 [3];
  int local_9c;
  
  pRVar2 = ref_cavity->ref_grid->node;
  ref_cell = ref_cavity->ref_grid->cell[8];
  iVar1 = ref_cavity->node;
  *min_del = -2.0;
  *min_add = -2.0;
  pRVar6 = ref_cavity->tet_list;
  local_d8 = min_del;
  local_c8 = min_add;
  if (pRVar6->n < 1) {
    dVar13 = 1.0;
    uVar11 = 0;
  }
  else {
    dVar13 = 1.0;
    uVar11 = 0;
    do {
      uVar5 = ref_cell_nodes(ref_cell,pRVar6->value[uVar11],local_a8);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x93f,"ref_cavity_change",(ulong)uVar5,"cell");
        return uVar5;
      }
      uVar5 = ref_node_tet_quality(pRVar2,local_a8,&local_e0);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x940,"ref_cavity_change",(ulong)uVar5,"new qual");
        return uVar5;
      }
      uVar11 = uVar11 + 1;
      if (local_e0 <= dVar13) {
        dVar13 = local_e0;
      }
      pRVar6 = ref_cavity->tet_list;
    } while ((long)uVar11 < (long)pRVar6->n);
  }
  if ((int)uVar11 != 0 && ref_cavity->debug != 0) {
    printf("- min %12.8f avg %12.8f n %d\n");
  }
  *local_d8 = dVar13;
  local_d0 = pRVar2;
  if (ref_cavity->maxface < 1) {
    dVar13 = 1.0;
    dVar14 = 0.0;
    uVar10 = 0;
  }
  else {
    dVar14 = 0.0;
    dVar13 = 1.0;
    lVar12 = 0;
    lVar8 = 0;
    uVar10 = 0;
    do {
      pRVar3 = ref_cavity->f2n;
      if (pRVar3[lVar8 * 3] != -1) {
        lVar7 = 0;
        bVar4 = false;
        do {
          if (iVar1 == *(int *)((long)pRVar3 + lVar7 * 4 + lVar12)) {
            bVar4 = true;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        if (!bVar4) {
          lVar7 = 0;
          do {
            local_a8[lVar7] = *(REF_INT *)((long)pRVar3 + lVar7 * 4 + lVar12);
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          local_c0 = dVar14;
          local_9c = iVar1;
          uVar5 = ref_node_tet_quality(local_d0,local_a8,&local_e0);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x95b,"ref_cavity_change",(ulong)uVar5,"new qual");
            return uVar5;
          }
          uVar10 = (ulong)((int)uVar10 + 1);
          dVar14 = local_c0 + local_e0;
          if (local_e0 <= dVar13) {
            dVar13 = local_e0;
          }
        }
      }
      lVar8 = lVar8 + 1;
      lVar12 = lVar12 + 0xc;
    } while (lVar8 < ref_cavity->maxface);
  }
  if (0 < (int)uVar10 && ref_cavity->debug != 0) {
    printf("+ min %12.8f avg %12.8f n %d\n",dVar13,dVar14 / (double)(int)uVar10);
  }
  pRVar2 = local_d0;
  *local_c8 = dVar13;
  if (ref_cavity->debug != 0) {
    printf(" min %12.8f <- %12.8f diff %12.8f n %d <- %d\n",dVar13,*local_d8,dVar13 - *local_d8,
           uVar10,uVar11 & 0xffffffff);
  }
  if (ref_cavity->debug != 0) {
    bVar4 = 0 < ref_cavity->maxseg;
    if (0 < ref_cavity->maxseg) {
      lVar12 = 4;
      lVar8 = 0;
      do {
        iVar9 = *(int *)((long)ref_cavity->s2n + lVar12 + -4);
        if ((iVar1 != iVar9 && iVar9 != -1) && (iVar1 != *(int *)((long)ref_cavity->s2n + lVar12)))
        {
          node0 = ref_cavity->surf_node;
          if (node0 == -1) {
            node0 = ref_cavity->node;
          }
          uVar5 = ref_node_ratio(pRVar2,node0,iVar9,&local_b0);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x974,"ref_cavity_change",(ulong)uVar5,"ratio");
            local_fc = uVar5;
            break;
          }
          iVar9 = ref_cavity->surf_node;
          if (iVar9 == -1) {
            iVar9 = ref_cavity->node;
          }
          uVar5 = ref_node_ratio(pRVar2,iVar9,*(REF_INT *)((long)ref_cavity->s2n + lVar12),&local_b8
                                );
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x977,"ref_cavity_change",(ulong)uVar5,"ratio");
            local_fc = uVar5;
            break;
          }
          printf("+ ratio %f %f\n",local_b0,local_b8);
        }
        lVar8 = lVar8 + 1;
        lVar12 = lVar12 + 0xc;
        bVar4 = lVar8 < ref_cavity->maxseg;
      } while (lVar8 < ref_cavity->maxseg);
    }
    if (bVar4) {
      return local_fc;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_change(REF_CAVITY ref_cavity, REF_DBL *min_del,
                                     REF_DBL *min_add) {
  REF_NODE ref_node = ref_grid_node(ref_cavity_grid(ref_cavity));
  REF_CELL ref_cell = ref_grid_tet(ref_cavity_grid(ref_cavity));
  REF_INT node = ref_cavity_node(ref_cavity);
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL quality, min_quality, total_quality;
  REF_INT face, face_node, n, n_del, n_add;
  REF_BOOL skip;

  *min_del = -2.0;
  *min_add = -2.0;

  n = 0;
  min_quality = 1.0;
  total_quality = 0.0;
  each_ref_list_item(ref_cavity_tet_list(ref_cavity), item) {
    cell = ref_list_value(ref_cavity_tet_list(ref_cavity), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell");
    RSS(ref_node_tet_quality(ref_node, nodes, &quality), "new qual");
    n++;
    total_quality += quality;
    min_quality = MIN(min_quality, quality);
  }
  if (ref_cavity_debug(ref_cavity) && n > 0)
    printf("- min %12.8f avg %12.8f n %d\n", min_quality,
           total_quality / ((REF_DBL)n), n);
  *min_del = min_quality;
  n_del = n;

  n = 0;
  min_quality = 1.0;
  total_quality = 0.0;
  each_ref_cavity_valid_face(ref_cavity, face) {
    skip = REF_FALSE;
    /* skip a collapsed triangle that in on the boundary of cavity */
    each_ref_cavity_face_node(ref_cavity, face_node) {
      if (node == ref_cavity_f2n(ref_cavity, face_node, face)) {
        skip = REF_TRUE;
      }
    }
    if (skip) continue;
    each_ref_cavity_face_node(ref_cavity, face_node) {
      nodes[face_node] = ref_cavity_f2n(ref_cavity, face_node, face);
    }
    nodes[3] = node;
    RSS(ref_node_tet_quality(ref_node, nodes, &quality), "new qual");
    n++;
    total_quality += quality;
    min_quality = MIN(min_quality, quality);
  }
  if (ref_cavity_debug(ref_cavity) && n > 0)
    printf("+ min %12.8f avg %12.8f n %d\n", min_quality,
           total_quality / ((REF_DBL)n), n);
  *min_add = min_quality;
  n_add = n;

  if (ref_cavity_debug(ref_cavity))
    printf(" min %12.8f <- %12.8f diff %12.8f n %d <- %d\n", *min_add, *min_del,
           *min_add - *min_del, n_add, n_del);

  if (ref_cavity_debug(ref_cavity)) {
    REF_INT seg;
    REF_DBL r0, r1;
    each_ref_cavity_valid_seg(ref_cavity, seg) {
      /* skip a seg attached to node */
      if (node == ref_cavity_s2n(ref_cavity, 0, seg) ||
          node == ref_cavity_s2n(ref_cavity, 1, seg))
        continue;
      RSS(ref_node_ratio(ref_node, ref_cavity_seg_node(ref_cavity),
                         ref_cavity_s2n(ref_cavity, 0, seg), &r0),
          "ratio");
      RSS(ref_node_ratio(ref_node, ref_cavity_seg_node(ref_cavity),
                         ref_cavity_s2n(ref_cavity, 1, seg), &r1),
          "ratio");
      printf("+ ratio %f %f\n", r0, r1);
    }
  }

  return REF_SUCCESS;
}